

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_ChangeTid(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  AActor **ppAVar1;
  uint uVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  PClass *pPVar5;
  int iVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  char *pcVar8;
  bool bVar9;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar3 = (AActor *)(param->field_0).field_1.a;
      if (pAVar3 != (AActor *)0x0) {
        if ((pAVar3->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar6 = (**(pAVar3->super_DThinker).super_DObject._vptr_DObject)(pAVar3);
          (pAVar3->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
        }
        pPVar7 = (pAVar3->super_DThinker).super_DObject.Class;
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar5 && bVar9) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar9 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar5) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042e43e;
        }
      }
      if (numparam == 1) {
        pcVar8 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          uVar2 = param[1].field_0.i;
          if ((pAVar3->tid != 0) && (pAVar3->iprev != (AActor **)0x0)) {
            *pAVar3->iprev = pAVar3->inext;
            if (pAVar3->inext != (AActor *)0x0) {
              pAVar3->inext->iprev = pAVar3->iprev;
            }
            pAVar3->inext = (AActor *)0x0;
            pAVar3->iprev = (AActor **)0x0;
          }
          pAVar3->tid = uVar2;
          if (uVar2 == 0) {
            pAVar3->inext = (AActor *)0x0;
            pAVar3->iprev = (AActor **)0x0;
          }
          else {
            ppAVar1 = AActor::TIDHash + (uVar2 & 0x7f);
            pAVar4 = *ppAVar1;
            pAVar3->inext = pAVar4;
            pAVar3->iprev = ppAVar1;
            *ppAVar1 = pAVar3;
            if (pAVar4 != (AActor *)0x0) {
              pAVar4->iprev = &pAVar3->inext;
            }
          }
          return 0;
        }
        pcVar8 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0xc9e,
                    "int AF_AActor_ChangeTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0042e43e:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0xc9d,"int AF_AActor_ChangeTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, ChangeTid)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(tid);
	self->RemoveFromHash();
	self->tid = tid;
	self->AddToHash();
	return 0;
}